

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d5c8::
ARTIteratorTest_emptyTreeSeek_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTIteratorTest_emptyTreeSeek_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  key_type kVar2;
  char *pcVar3;
  char *in_R9;
  string local_520;
  AssertHelper local_500;
  Message local_4f8;
  bool local_4e9;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_4b8;
  bool in_stack_fffffffffffffb57;
  undefined7 in_stack_fffffffffffffb58;
  bool in_stack_fffffffffffffb5f;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar__2;
  bool local_481;
  undefined1 local_480 [7];
  bool match_1;
  iterator e_1;
  AssertHelper local_2f0;
  Message local_2e8;
  bool local_2d9;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_2a8;
  Message local_2a0;
  bool local_291;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_270;
  bool local_261;
  undefined1 local_260 [7];
  bool match;
  iterator e;
  TypeParam *db;
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  ARTIteratorTest_emptyTreeSeek_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  verifier.key_views.
  super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  tree_verifier((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 *)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
                in_stack_fffffffffffffb57);
  e.keybuf_.off =
       (size_t)unodb::test::
               tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
               ::get_db((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                         *)&db);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::test_only_iterator
            ((iterator *)local_260,
             (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)e.keybuf_.off
            );
  local_261 = false;
  kVar2 = unodb::test::
          tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                             *)&db,0);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&local_270.key_bytes,kVar2);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            ((iterator *)local_260,(art_key_type)local_270,&local_261,true);
  local_291 = unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
              iterator::valid((iterator *)local_260);
  local_291 = !local_291;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_290,&local_291,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar1) {
    testing::Message::Message(&local_2a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_290,(AssertionResult *)"e.valid()",
               "true","false",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__1.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x128,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper(&local_2a8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  local_2d9 = (bool)(~local_261 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2d8,&local_2d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar1) {
    testing::Message::Message(&local_2e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e_1.keybuf_.off,(internal *)local_2d8,(AssertionResult *)0x30452b,"true",
               "false",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &e_1.keybuf_.off);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x129,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    std::__cxx11::string::~string((string *)&e_1.keybuf_.off);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::~iterator
            ((iterator *)local_260);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::test_only_iterator
            ((iterator *)local_480,
             (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)e.keybuf_.off
            );
  local_481 = false;
  kVar2 = unodb::test::
          tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::coerce_key<int>((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                             *)&db,0);
  unodb::detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&gtest_ar__2.message_,kVar2);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            ((iterator *)local_480,
             (art_key_type)
             gtest_ar__2.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,&local_481,false);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::valid
            ((iterator *)local_480);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4a0,(bool *)&stack0xfffffffffffffb5f,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a0);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xfffffffffffffb50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_4a0,(AssertionResult *)"e.valid()",
               "true","false",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__3.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_4b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x130,pcVar3);
    testing::internal::AssertHelper::operator=(&local_4b8,(Message *)&stack0xfffffffffffffb50);
    testing::internal::AssertHelper::~AssertHelper(&local_4b8);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message((Message *)&stack0xfffffffffffffb50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
  local_4e9 = (bool)(~local_481 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4e8,&local_4e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
  if (!bVar1) {
    testing::Message::Message(&local_4f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_520,(internal *)local_4e8,(AssertionResult *)0x30452b,"true","false",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_520);
    testing::internal::AssertHelper::AssertHelper
              (&local_500,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x131,pcVar3);
    testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
    testing::internal::AssertHelper::~AssertHelper(&local_500);
    std::__cxx11::string::~string((string *)&local_520);
    testing::Message::~Message(&local_4f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
  unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::~iterator
            ((iterator *)local_480);
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  ~tree_verifier((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                  *)&db);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, emptyTreeSeek) {
  using Key = typename TypeParam::key_type;
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  {
    auto e = db.test_only_iterator();
    bool match = false;
    e.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
           true /*fwd*/);
    UNODB_EXPECT_FALSE(e.valid());
    UNODB_EXPECT_FALSE(match);
  }
  {
    auto e = db.test_only_iterator();
    bool match = false;
    e.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
           false /*fwd*/);
    UNODB_EXPECT_FALSE(e.valid());
    UNODB_EXPECT_FALSE(match);
  }
}